

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O2

pair<const_slang::ast::ClassType_*,_bool> __thiscall
slang::ast::resolveNewClassTarget
          (ast *this,NameSyntax *nameSyntax,ASTContext *context,Type **assignmentTarget,
          SourceRange range)

{
  bool bVar1;
  ClassType *pCVar2;
  Type *pTVar3;
  ClassType *pCVar4;
  Diagnostic *this_00;
  undefined8 extraout_RDX;
  undefined8 uVar5;
  char *pcVar6;
  DiagCode code;
  size_t sVar7;
  Token TVar8;
  pair<const_slang::ast::ClassType_*,_bool> pVar9;
  SourceRange SVar10;
  string_view arg;
  SourceRange sourceRange;
  
  if (*(int *)this == 0x67) {
    pTVar3 = (Type *)(context->scope).ptr;
    if (pTVar3 != (Type *)0x0) {
      bVar1 = Type::isClass(pTVar3);
      pTVar3 = (Type *)(context->scope).ptr;
      if (bVar1) {
        pCVar2 = (ClassType *)Type::getCanonicalType(pTVar3);
LAB_003b3e95:
        if (pCVar2->isAbstract == true) {
          code.subsystem = Expressions;
          code.code = 0x7d;
        }
        else {
          pCVar4 = pCVar2;
          if (pCVar2->isInterface != true) goto LAB_003b3efe;
          code.subsystem = Expressions;
          code.code = 0x7c;
        }
        sourceRange.endLoc = range.startLoc;
        sourceRange.startLoc = (SourceLocation)assignmentTarget;
        this_00 = ASTContext::addDiag((ASTContext *)nameSyntax,code,sourceRange);
        sVar7 = (pCVar2->super_Type).super_Symbol.name._M_len;
        pcVar6 = (pCVar2->super_Type).super_Symbol.name._M_str;
LAB_003b3ef3:
        arg._M_str = pcVar6;
        arg._M_len = sVar7;
        Diagnostic::operator<<(this_00,arg);
        goto LAB_003b3efb;
      }
      if (pTVar3 != (Type *)0x0) {
        bVar1 = Type::isError(pTVar3);
        if (bVar1) goto LAB_003b3efb;
      }
    }
    SVar10.endLoc = range.startLoc;
    SVar10.startLoc = (SourceLocation)assignmentTarget;
    ASTContext::addDiag((ASTContext *)nameSyntax,(DiagCode)0x7b0007,SVar10);
LAB_003b3efb:
    pCVar4 = (ClassType *)0x0;
  }
  else {
    TVar8 = slang::syntax::SyntaxNode::getLastToken(*(SyntaxNode **)(this + 0x18));
    if (TVar8.kind == SuperKeyword) {
      pVar9 = Lookup::getContainingClass
                        (*(Scope **)&(nameSyntax->super_ExpressionSyntax).super_SyntaxNode);
      pCVar4 = pVar9.first;
      if ((pCVar4 != (ClassType *)0x0) && ((pCVar4->super_Type).super_Symbol.name._M_len != 0)) {
        pTVar3 = ClassType::getBaseClass(pCVar4);
        if (pTVar3 == (Type *)0x0) {
          SVar10 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)this);
          this_00 = ASTContext::addDiag((ASTContext *)nameSyntax,(DiagCode)0x2f000a,SVar10);
          sVar7 = (pCVar4->super_Type).super_Symbol.name._M_len;
          pcVar6 = (pCVar4->super_Type).super_Symbol.name._M_str;
          goto LAB_003b3ef3;
        }
        bVar1 = Type::isError(pTVar3);
        if (!bVar1) {
          pCVar4 = (ClassType *)Type::getCanonicalType(pTVar3);
          (context->scope).ptr =
               *(Scope **)
                (**(long **)&(nameSyntax->super_ExpressionSyntax).super_SyntaxNode + 0x188);
          uVar5 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
          goto LAB_003b3f00;
        }
      }
      goto LAB_003b3efb;
    }
    pCVar4 = (ClassType *)0x0;
    pCVar2 = Lookup::findClass(*(NameSyntax **)(this + 0x18),(ASTContext *)nameSyntax,
                               (optional<slang::DiagCode>)0x0);
    if (pCVar2 != (ClassType *)0x0) {
      (context->scope).ptr = (Scope *)pCVar2;
      goto LAB_003b3e95;
    }
  }
LAB_003b3efe:
  uVar5 = 0;
LAB_003b3f00:
  pVar9._8_8_ = uVar5;
  pVar9.first = pCVar4;
  return pVar9;
}

Assistant:

static std::pair<const ClassType*, bool> resolveNewClassTarget(const NameSyntax& nameSyntax,
                                                               const ASTContext& context,
                                                               const Type*& assignmentTarget,
                                                               SourceRange range) {
    // If the new expression is typed, look up that type as the target.
    // Otherwise, the target must come from the expression context.
    bool isSuperClass = false;
    const ClassType* classType = nullptr;
    if (nameSyntax.kind == SyntaxKind::ConstructorName) {
        if (!assignmentTarget || !assignmentTarget->isClass()) {
            if (!assignmentTarget || !assignmentTarget->isError())
                context.addDiag(diag::NewClassTarget, range);
            return {nullptr, false};
        }

        classType = &assignmentTarget->getCanonicalType().as<ClassType>();
    }
    else {
        auto& scoped = nameSyntax.as<ScopedNameSyntax>();
        if (scoped.left->getLastToken().kind == TokenKind::SuperKeyword) {
            // This is a super.new invocation, so find the base class's
            // constructor. This is relative to our current context, not
            // any particular assignment target.
            auto [ct, _] = Lookup::getContainingClass(*context.scope);
            classType = ct;
            if (!classType || classType->name.empty()) {
                // Parser already emitted an error for this case.
                return {nullptr, false};
            }

            auto base = classType->getBaseClass();
            if (!base) {
                context.addDiag(diag::SuperNoBase, nameSyntax.sourceRange()) << classType->name;
                return {nullptr, false};
            }

            if (base->isError())
                return {nullptr, false};

            classType = &base->as<Type>().getCanonicalType().as<ClassType>();
            assignmentTarget = &context.getCompilation().getVoidType();
            isSuperClass = true;
        }
        else {
            auto& className = *nameSyntax.as<ScopedNameSyntax>().left;
            classType = Lookup::findClass(className, context);
            if (!classType)
                return {nullptr, false};

            assignmentTarget = classType;
        }
    }

    if (!isSuperClass && classType->isAbstract) {
        context.addDiag(diag::NewVirtualClass, range) << classType->name;
        return {nullptr, false};
    }

    if (!isSuperClass && classType->isInterface) {
        context.addDiag(diag::NewInterfaceClass, range) << classType->name;
        return {nullptr, false};
    }

    return {classType, isSuperClass};
}